

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::Global_set(w3Interp *this)

{
  pointer *ppwVar1;
  undefined8 extraout_RAX;
  long unaff_R12;
  ulong uVar2;
  w3Stack *unaff_R15;
  undefined1 local_40 [32];
  
  uVar2 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  if (uVar2 < (ulong)((long)(this->module->globals).
                            super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->module->globals).
                            super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
                            super__Vector_impl_data._M_start >> 5)) {
    unaff_R15 = &this->super_w3Stack;
    w3Stack::AssertTopIsValue(unaff_R15);
    unaff_R12 = uVar2 * 0x20;
    if ((this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
        super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].value.tag ==
        (this->module->globals).super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2].global_type.value_type) {
      w3Stack::AssertTopIsValue(unaff_R15);
      (this->module_instance->globals).
      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2].value.value =
           (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].value.value;
      w3Stack::AssertTopIsValue(unaff_R15);
      ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                 super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppwVar1 = *ppwVar1 + -1;
      return;
    }
  }
  else {
    this = (w3Interp *)local_40;
    StringFormat_abi_cxx11_((string *)this,"%lX %lX",uVar2);
    AssertFailedFormat("i < module->globals.size ()",(string *)this);
  }
  w3Stack::AssertTopIsValue(unaff_R15);
  StringFormat_abi_cxx11_
            ((string *)local_40,"%X %X",
             (ulong)*(byte *)(*(long *)((long)&this->super_w3Stack + 8) + -0x28),
             (ulong)(&(((this->module->globals).super__Vector_base<Global,_std::allocator<Global>_>.
                        _M_impl.super__Vector_impl_data._M_start)->global_type).value_type)
                    [unaff_R12]);
  AssertFailedFormat("tag () == module->globals [i].global_type.value_type",(string *)local_40);
  if ((undefined1 *)local_40._0_8_ != local_40 + 0x10) {
    operator_delete((void *)local_40._0_8_,(ulong)(local_40._16_8_ + 1));
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

INTERP (Global_set)
{
    const size_t i = instr->u32;
    AssertFormat (i < module->globals.size (), ("%" FORMAT_SIZE "X %" FORMAT_SIZE "X", i, module->globals.size ()));
    // TODO assert mutable
    AssertFormat (tag () == module->globals [i].global_type.value_type, ("%X %X", tag (), module->globals [i].global_type.value_type));
    module_instance->globals [i].value.value = value ();
    pop_value ();
}